

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

HighsDebugStatus __thiscall
HEkkPrimal::debugPrimalSteepestEdgeWeights(HEkkPrimal *this,HighsInt alt_debug_level)

{
  char cVar1;
  HighsInt HVar2;
  const_reference pvVar3;
  reference pvVar4;
  int *__b;
  uint *puVar5;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar6;
  pointer pdVar7;
  double large_relative_primal_steepest_edge_weight_error;
  double relative_primal_steepest_edge_weight_error;
  double error;
  HighsInt iVar_2;
  vector<double,_std::allocator<double>_> updated_primal_edge_weight;
  double true_weight;
  HighsInt iVar_1;
  HighsInt iCheck;
  HighsInt iVar;
  HVector local_col_aq;
  HighsInt num_check_weight;
  double primal_steepest_edge_weight_error;
  double primal_steepest_edge_weight_norm;
  vector<signed_char,_std::allocator<signed_char>_> nonbasic_flag;
  HighsInt num_row;
  HighsLp *lp;
  HighsInt use_debug_level;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  HighsRandom *in_stack_fffffffffffffe38;
  value_type vVar8;
  HEkkPrimal *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe78;
  uint local_154;
  vector<double,_std::allocator<double>_> local_150;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_128;
  int local_124 [25];
  HEkkPrimal *in_stack_ffffffffffffff40;
  uint local_54;
  double local_50;
  double local_48;
  vector<signed_char,_std::allocator<signed_char>_> local_40;
  undefined4 local_24;
  pointer local_20;
  int local_18;
  HighsDebugStatus local_4;
  
  if (in_ESI < 0) {
    in_ESI = *(int *)((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[1] + 0x15c);
  }
  if (in_ESI < 2) {
    return kNotChecked;
  }
  pdVar7 = (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_20 = pdVar7 + 0x433;
  local_24 = *(undefined4 *)((long)pdVar7 + 0x219c);
  local_18 = in_ESI;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_RDI,
             (vector<signed_char,_std::allocator<signed_char>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffe78));
  local_48 = 0.0;
  local_50 = 0.0;
  HVectorBase<double>::HVectorBase
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  HVectorBase<double>::setup
            ((HVectorBase<double> *)in_stack_fffffffffffffe40,
             (HighsInt)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  if (local_18 < 3) {
    for (local_124[3] = 0;
        local_124[3] <
        *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; local_124[3] = local_124[3] + 1) {
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&local_40,(long)local_124[3]);
      cVar1 = *pvVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI + 8,(long)local_124[3]);
      local_48 = ABS((double)(int)cVar1 * *pvVar4) + local_48;
    }
    local_124[2] = 1;
    local_124[1] = 10;
    local_124[0] = *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start / 10;
    __b = std::min<int>(local_124 + 1,local_124);
    puVar5 = (uint *)std::max<int>(local_124 + 2,__b);
    local_54 = *puVar5;
    for (local_128 = 0; local_128 < (int)local_54; local_128 = local_128 + 1) {
      do {
        HVar2 = HighsRandom::integer(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
        pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&local_40,(long)HVar2);
      } while (*pvVar3 == '\0');
      dVar6 = computePrimalSteepestEdgeWeight
                        (in_stack_fffffffffffffe40,
                         (HighsInt)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                         (HVector *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 8,(long)HVar2);
      local_50 = ABS(*pvVar4 - dVar6) + local_50;
    }
  }
  else {
    local_54 = *(uint *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
    std::vector<double,_std::allocator<double>_>::vector
              (in_RDI,(vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_ESI,in_stack_fffffffffffffe78));
    computePrimalSteepestEdgeWeights(in_stack_ffffffffffffff40);
    for (local_154 = 0;
        (int)local_154 <
        *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; local_154 = local_154 + 1) {
      pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&local_40,(long)(int)local_154);
      if (*pvVar3 != '\0') {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDI + 8,(long)(int)local_154);
        local_48 = ABS(*pvVar4) + local_48;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_150,(long)(int)local_154);
        in_stack_fffffffffffffe40 = (HEkkPrimal *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDI + 8,(long)(int)local_154);
        dVar6 = ABS((double)in_stack_fffffffffffffe40 - *pvVar4);
        if (0.0001 < dVar6) {
          in_stack_fffffffffffffe34 = local_154;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RDI + 8,(long)(int)local_154);
          vVar8 = *pvVar4;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_150,(long)(int)local_154);
          printf("debugPrimalSteepestEdgeWeights: var = %2d; weight (true = %10.4g; updated = %10.4g) error = %10.4g\n"
                 ,vVar8,SUB84(*pvVar4,0),dVar6,(ulong)in_stack_fffffffffffffe34);
        }
        local_50 = dVar6 + local_50;
      }
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40);
  }
  pdVar7 = (pointer)(local_50 / local_48);
  if ((double)in_RDI[0x42].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage * 10.0 < (double)pdVar7) {
    printf("HEkk::debugPrimalSteepestEdgeWeights Iteration %5d: Checked %2d weights: error = %10.4g; norm = %10.4g; relative error = %10.4g\n"
           ,local_50,SUB84(local_48,0),pdVar7,
           (ulong)*(uint *)((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + 0x6df),(ulong)local_54);
    in_RDI[0x42].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = pdVar7;
    if (0.001 < (double)pdVar7) {
      local_4 = kLargeError;
      goto LAB_007b0849;
    }
  }
  local_4 = kOk;
LAB_007b0849:
  HVectorBase<double>::~HVectorBase
            ((HVectorBase<double> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffe40);
  return local_4;
}

Assistant:

HighsDebugStatus HEkkPrimal::debugPrimalSteepestEdgeWeights(
    const HighsInt alt_debug_level) {
  const HighsInt use_debug_level =
      alt_debug_level >= 0 ? alt_debug_level
                           : ekk_instance_.options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = ekk_instance_.lp_;
  const HighsInt num_row = lp.num_row_;
  const std::vector<int8_t> nonbasic_flag = ekk_instance_.basis_.nonbasicFlag_;
  double primal_steepest_edge_weight_norm = 0;
  double primal_steepest_edge_weight_error = 0;
  HighsInt num_check_weight;
  HVector local_col_aq;
  local_col_aq.setup(num_row);
  if (use_debug_level < kHighsDebugLevelExpensive) {
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      primal_steepest_edge_weight_norm +=
          std::fabs(nonbasic_flag[iVar] * edge_weight_[iVar]);
    }
    // Just check a few weights
    num_check_weight =
        std::max((HighsInt)1, std::min((HighsInt)10, num_tot / 10));
    for (HighsInt iCheck = 0; iCheck < num_check_weight; iCheck++) {
      HighsInt iVar;
      for (;;) {
        iVar = random_.integer(num_tot);
        if (nonbasic_flag[iVar]) break;
      }
      const double true_weight =
          computePrimalSteepestEdgeWeight(iVar, local_col_aq);
      primal_steepest_edge_weight_error +=
          std::fabs(edge_weight_[iVar] - true_weight);
    }
  } else {
    // Check all weights
    num_check_weight = num_col;
    std::vector<double> updated_primal_edge_weight = edge_weight_;
    computePrimalSteepestEdgeWeights();
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      if (!nonbasic_flag[iVar]) continue;
      primal_steepest_edge_weight_norm += std::fabs(edge_weight_[iVar]);
      const double error =
          std::fabs(updated_primal_edge_weight[iVar] - edge_weight_[iVar]);
      if (error > 1e-4)
        printf(
            "debugPrimalSteepestEdgeWeights: var = %2d; weight (true = %10.4g; "
            "updated = %10.4g) error = %10.4g\n",
            (int)iVar, edge_weight_[iVar], updated_primal_edge_weight[iVar],
            error);
      primal_steepest_edge_weight_error += error;
    }
    edge_weight_ = updated_primal_edge_weight;
  }
  // Now assess the relative error
  assert(primal_steepest_edge_weight_norm > 0);
  double relative_primal_steepest_edge_weight_error =
      primal_steepest_edge_weight_error / primal_steepest_edge_weight_norm;
  const double large_relative_primal_steepest_edge_weight_error = 1e-3;
  if (relative_primal_steepest_edge_weight_error >
      10 * debug_max_relative_primal_steepest_edge_weight_error) {
    printf(
        "HEkk::debugPrimalSteepestEdgeWeights Iteration %5d: Checked %2d "
        "weights: "
        "error = %10.4g; norm = %10.4g; relative error = %10.4g\n",
        (int)ekk_instance_.iteration_count_, (int)num_check_weight,
        primal_steepest_edge_weight_error, primal_steepest_edge_weight_norm,
        relative_primal_steepest_edge_weight_error);
    debug_max_relative_primal_steepest_edge_weight_error =
        relative_primal_steepest_edge_weight_error;
    if (relative_primal_steepest_edge_weight_error >
        large_relative_primal_steepest_edge_weight_error)
      return HighsDebugStatus::kLargeError;
  }
  return HighsDebugStatus::kOk;
}